

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::append_member_name
          (string *__return_storage_ptr__,CompilerMSL *this,string *qualifier,SPIRType *type,
          uint32_t index)

{
  bool bVar1;
  long lVar2;
  uint32_t uVar3;
  undefined4 in_register_00000084;
  BuiltIn builtin;
  string mbr_name;
  BuiltIn local_74;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_74 = BuiltInMax;
  uVar3 = index;
  bVar1 = Compiler::is_member_builtin((Compiler *)this,type,index,&local_74);
  if (bVar1) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              (__return_storage_ptr__,this,(ulong)local_74,(ulong)type->storage);
  }
  else {
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,type,index);
    lVar2 = ::std::__cxx11::string::find_first_not_of((char *)&local_70,0x2f4e20,0);
    if (lVar2 == -1) {
      local_50[0] = local_40;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_50,(ulong)&local_70);
    }
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&>
              (__return_storage_ptr__,(spirv_cross *)qualifier,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f4e20,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000084,uVar3));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::append_member_name(const string &qualifier, const SPIRType &type, uint32_t index)
{
	// Don't qualify Builtin names because they are unique and are treated as such when building expressions
	BuiltIn builtin = BuiltInMax;
	if (is_member_builtin(type, index, &builtin))
		return builtin_to_glsl(builtin, type.storage);

	// Strip any underscore prefix from member name
	string mbr_name = to_member_name(type, index);
	size_t startPos = mbr_name.find_first_not_of("_");
	mbr_name = (startPos != string::npos) ? mbr_name.substr(startPos) : "";
	return join(qualifier, "_", mbr_name);
}